

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

lu_mem checklist(global_State *g,int maybedead,int tof,GCObject *newl,GCObject *survival,
                GCObject *old,GCObject *reallyold)

{
  lu_mem total;
  int local_34;
  
  total = 0;
  local_34 = maybedead;
  while( true ) {
    if (newl == survival) {
      while( true ) {
        if (survival == old) {
          while( true ) {
            if (old == reallyold) {
              while( true ) {
                if (reallyold == (GCObject *)0x0) {
                  return total;
                }
                checkobject(g,reallyold,0,4);
                incifingray(g,reallyold,&total);
                if ((bool)((reallyold->marked & 0x40) >> 6) == (tof == 0)) break;
                reallyold = reallyold->next;
              }
              __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x1fc,
                            "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                           );
            }
            checkobject(g,old,0,3);
            incifingray(g,old,&total);
            if ((bool)((old->marked & 0x40) >> 6) == (tof == 0)) break;
            old = old->next;
          }
          __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x1f7,
                        "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                       );
        }
        checkobject(g,survival,0,1);
        incifingray(g,survival,&total);
        if ((bool)((survival->marked & 0x40) >> 6) == (tof == 0)) break;
        survival = survival->next;
      }
      __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x1f2,
                    "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                   );
    }
    checkobject(g,newl,local_34,0);
    incifingray(g,newl,&total);
    if ((bool)((newl->marked & 0x40) >> 6) == (tof == 0)) break;
    newl = newl->next;
  }
  __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x1ed,
                "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
               );
}

Assistant:

static lu_mem checklist (global_State *g, int maybedead, int tof,
  GCObject *newl, GCObject *survival, GCObject *old, GCObject *reallyold) {
  GCObject *o;
  lu_mem total = 0;  /* number of object that should be in  gray lists */
  for (o = newl; o != survival; o = o->next) {
    checkobject(g, o, maybedead, G_NEW);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = survival; o != old; o = o->next) {
    checkobject(g, o, 0, G_SURVIVAL);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = old; o != reallyold; o = o->next) {
    checkobject(g, o, 0, G_OLD1);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = reallyold; o != NULL; o = o->next) {
    checkobject(g, o, 0, G_OLD);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  return total;
}